

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenerators::SetupAutoMocTarget
          (cmQtAutoGenerators *this,cmTarget *target,string *autogenTargetName,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *configIncludes,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *configDefines)

{
  cmMakefile *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  string *psVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  reference pbVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  cmTarget *pcVar9;
  char *local_4d0;
  allocator local_4a1;
  string local_4a0;
  allocator local_479;
  string local_478;
  allocator local_451;
  string local_450;
  cmTarget *local_430;
  cmTarget *qt4Moc;
  string local_420;
  allocator local_3f9;
  string local_3f8;
  undefined4 local_3d8;
  allocator local_3d1;
  string local_3d0;
  cmTarget *local_3b0;
  cmTarget *qt5Moc;
  string local_3a0;
  char *local_380;
  char *qtVersion;
  string local_358;
  undefined1 local_338 [8];
  string config_moc_compile_defs;
  string config_moc_incs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  const_iterator li;
  allocator local_2b9;
  string local_2b8;
  string local_298;
  allocator local_271;
  string local_270;
  string local_250;
  string *local_230;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string _moc_compile_defs;
  string _moc_incs;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  byte local_179;
  undefined1 local_178 [7];
  bool relaxedMode;
  allocator local_151;
  string local_150;
  string local_130;
  allocator local_109;
  string local_108;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  undefined1 local_98 [8];
  string _moc_options;
  allocator local_61;
  string local_60;
  char *local_40;
  char *tmp;
  cmMakefile *makefile;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *configDefines_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *configIncludes_local;
  string *autogenTargetName_local;
  cmTarget *target_local;
  cmQtAutoGenerators *this_local;
  
  makefile = (cmMakefile *)configDefines;
  configDefines_local = configIncludes;
  configIncludes_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)autogenTargetName;
  autogenTargetName_local = (string *)target;
  target_local = (cmTarget *)this;
  tmp = (char *)cmTarget::GetMakefile(target);
  psVar1 = autogenTargetName_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"AUTOMOC_MOC_OPTIONS",&local_61);
  pcVar4 = cmTarget::GetProperty((cmTarget *)psVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_4d0 = pcVar4;
  if (pcVar4 == (char *)0x0) {
    local_4d0 = "";
  }
  local_40 = pcVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_98,local_4d0,&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  pcVar4 = tmp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"_moc_options",&local_c1);
  cmOutputConverter::EscapeForCMake(&local_e8,(string *)local_98);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition((cmMakefile *)pcVar4,&local_c0,pcVar5);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  pcVar4 = tmp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"_skip_moc",&local_109);
  cmOutputConverter::EscapeForCMake(&local_130,&this->SkipMoc);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition((cmMakefile *)pcVar4,&local_108,pcVar5);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  pcVar4 = tmp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"_moc_headers",&local_151);
  cmOutputConverter::EscapeForCMake((string *)local_178,&this->Headers);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition((cmMakefile *)pcVar4,&local_150,pcVar5);
  std::__cxx11::string::~string((string *)local_178);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  pcVar4 = tmp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"CMAKE_AUTOMOC_RELAXED_MODE",&local_1a1);
  bVar2 = cmMakefile::IsOn((cmMakefile *)pcVar4,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  pcVar4 = tmp;
  local_179 = bVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c8,"_moc_relaxed_mode",
             (allocator *)(_moc_incs.field_2._M_local_buf + 0xf));
  pcVar5 = "FALSE";
  if ((local_179 & 1) != 0) {
    pcVar5 = "TRUE";
  }
  cmMakefile::AddDefinition((cmMakefile *)pcVar4,&local_1c8,pcVar5);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)(_moc_incs.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)(_moc_compile_defs.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&config);
  cmMakefile::GetConfigurations
            (&local_250,(cmMakefile *)tmp,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config,true);
  local_230 = &local_250;
  GetCompileDefinitionsAndDirectories
            ((cmTarget *)autogenTargetName_local,local_230,
             (string *)((long)&_moc_compile_defs.field_2 + 8),
             (string *)
             &configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar4 = tmp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"_moc_incs",&local_271);
  cmOutputConverter::EscapeForCMake(&local_298,(string *)((long)&_moc_compile_defs.field_2 + 8));
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition((cmMakefile *)pcVar4,&local_270,pcVar5);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  pcVar4 = tmp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"_moc_compile_defs",&local_2b9);
  cmOutputConverter::EscapeForCMake
            ((string *)&li,
             (string *)
             &configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmMakefile::AddDefinition((cmMakefile *)pcVar4,&local_2b8,pcVar5);
  std::__cxx11::string::~string((string *)&li);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  local_2f0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_2e8,&local_2f0);
  while( true ) {
    config_moc_incs.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config);
    bVar2 = __gnu_cxx::operator!=
                      (&local_2e8,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&config_moc_incs.field_2 + 8));
    pcVar4 = tmp;
    if (!bVar2) break;
    std::__cxx11::string::string((string *)(config_moc_compile_defs.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_338);
    psVar1 = autogenTargetName_local;
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_2e8);
    GetCompileDefinitionsAndDirectories
              ((cmTarget *)psVar1,pbVar6,
               (string *)(config_moc_compile_defs.field_2._M_local_buf + 8),(string *)local_338);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&config_moc_compile_defs.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&_moc_compile_defs.field_2 + 8));
    if (bVar2) {
      cmOutputConverter::EscapeForCMake
                (&local_358,(string *)((long)&config_moc_compile_defs.field_2 + 8));
      this_01 = configDefines_local;
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_2e8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_01,pbVar6);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_358);
      std::__cxx11::string::~string((string *)&local_358);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)(_moc_compile_defs.field_2._M_local_buf + 8),
                   (string *)(config_moc_compile_defs.field_2._M_local_buf + 8));
      }
    }
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_338,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &configs.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      cmOutputConverter::EscapeForCMake((string *)&qtVersion,(string *)local_338);
      this_00 = makefile;
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_2e8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this_00,pbVar6);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&qtVersion);
      std::__cxx11::string::~string((string *)&qtVersion);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)
                   &configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_338);
      }
    }
    std::__cxx11::string::~string((string *)local_338);
    std::__cxx11::string::~string((string *)(config_moc_compile_defs.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_2e8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3a0,"_target_qt_version",(allocator *)((long)&qt5Moc + 7));
  pcVar4 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&qt5Moc + 7));
  local_380 = pcVar4;
  iVar3 = strcmp(pcVar4,"5");
  pcVar4 = tmp;
  if (iVar3 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3d0,"Qt5::moc",&local_3d1);
    pcVar9 = cmMakefile::FindTargetToUse((cmMakefile *)pcVar4,&local_3d0,false);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
    pcVar4 = tmp;
    local_3b0 = pcVar9;
    if (pcVar9 == (cmTarget *)0x0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error("Qt5::moc target not found ",pcVar4,(char *)0x0,(char *)0x0);
      local_3d8 = 1;
      goto LAB_005c49a4;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f8,"_qt_moc_executable",&local_3f9);
    pcVar9 = local_3b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_420,"",(allocator *)((long)&qt4Moc + 7));
    pcVar5 = cmTarget::GetLocation(pcVar9,&local_420);
    cmMakefile::AddDefinition((cmMakefile *)pcVar4,&local_3f8,pcVar5);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator((allocator<char> *)((long)&qt4Moc + 7));
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  }
  else {
    iVar3 = strcmp(local_380,"4");
    pcVar4 = tmp;
    if (iVar3 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_450,"Qt4::moc",&local_451);
      pcVar9 = cmMakefile::FindTargetToUse((cmMakefile *)pcVar4,&local_450,false);
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator((allocator<char> *)&local_451);
      pcVar4 = tmp;
      local_430 = pcVar9;
      if (pcVar9 == (cmTarget *)0x0) {
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Error("Qt4::moc target not found ",pcVar4,(char *)0x0,(char *)0x0);
        local_3d8 = 1;
        goto LAB_005c49a4;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_478,"_qt_moc_executable",&local_479);
      pcVar9 = local_430;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4a0,"",&local_4a1);
      pcVar5 = cmTarget::GetLocation(pcVar9,&local_4a0);
      cmMakefile::AddDefinition((cmMakefile *)pcVar4,&local_478,pcVar5);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator((allocator<char> *)&local_479);
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error
                ("The CMAKE_AUTOMOC feature supports only Qt 4 and Qt 5 ",pcVar4,(char *)0x0,
                 (char *)0x0);
    }
  }
  local_3d8 = 0;
LAB_005c49a4:
  std::__cxx11::string::~string((string *)&local_250);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&config);
  std::__cxx11::string::~string
            ((string *)
             &configs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(_moc_compile_defs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_98);
  return;
}

Assistant:

void cmQtAutoGenerators::SetupAutoMocTarget(cmTarget const* target,
                          const std::string &autogenTargetName,
                          std::map<std::string, std::string> &configIncludes,
                          std::map<std::string, std::string> &configDefines)
{
  cmMakefile* makefile = target->GetMakefile();

  const char* tmp = target->GetProperty("AUTOMOC_MOC_OPTIONS");
  std::string _moc_options = (tmp!=0 ? tmp : "");
  makefile->AddDefinition("_moc_options",
          cmOutputConverter::EscapeForCMake(_moc_options).c_str());
  makefile->AddDefinition("_skip_moc",
          cmOutputConverter::EscapeForCMake(this->SkipMoc).c_str());
  makefile->AddDefinition("_moc_headers",
          cmOutputConverter::EscapeForCMake(this->Headers).c_str());
  bool relaxedMode = makefile->IsOn("CMAKE_AUTOMOC_RELAXED_MODE");
  makefile->AddDefinition("_moc_relaxed_mode", relaxedMode ? "TRUE" : "FALSE");

  std::string _moc_incs;
  std::string _moc_compile_defs;
  std::vector<std::string> configs;
  const std::string& config = makefile->GetConfigurations(configs);
  GetCompileDefinitionsAndDirectories(target, config,
                                      _moc_incs, _moc_compile_defs);

  makefile->AddDefinition("_moc_incs",
          cmOutputConverter::EscapeForCMake(_moc_incs).c_str());
  makefile->AddDefinition("_moc_compile_defs",
          cmOutputConverter::EscapeForCMake(_moc_compile_defs).c_str());

  for (std::vector<std::string>::const_iterator li = configs.begin();
       li != configs.end(); ++li)
    {
    std::string config_moc_incs;
    std::string config_moc_compile_defs;
    GetCompileDefinitionsAndDirectories(target, *li,
                                        config_moc_incs,
                                        config_moc_compile_defs);
    if (config_moc_incs != _moc_incs)
      {
      configIncludes[*li] =
                    cmOutputConverter::EscapeForCMake(config_moc_incs);
      if(_moc_incs.empty())
        {
        _moc_incs = config_moc_incs;
        }
      }
    if (config_moc_compile_defs != _moc_compile_defs)
      {
      configDefines[*li] =
            cmOutputConverter::EscapeForCMake(config_moc_compile_defs);
      if(_moc_compile_defs.empty())
        {
        _moc_compile_defs = config_moc_compile_defs;
        }
      }
    }

  const char *qtVersion = makefile->GetDefinition("_target_qt_version");
  if (strcmp(qtVersion, "5") == 0)
    {
    cmTarget *qt5Moc = makefile->FindTargetToUse("Qt5::moc");
    if (!qt5Moc)
      {
      cmSystemTools::Error("Qt5::moc target not found ",
                          autogenTargetName.c_str());
      return;
      }
    makefile->AddDefinition("_qt_moc_executable", qt5Moc->GetLocation(""));
    }
  else if (strcmp(qtVersion, "4") == 0)
    {
    cmTarget *qt4Moc = makefile->FindTargetToUse("Qt4::moc");
    if (!qt4Moc)
      {
      cmSystemTools::Error("Qt4::moc target not found ",
                          autogenTargetName.c_str());
      return;
      }
    makefile->AddDefinition("_qt_moc_executable", qt4Moc->GetLocation(""));
    }
  else
    {
    cmSystemTools::Error("The CMAKE_AUTOMOC feature supports only Qt 4 and "
                        "Qt 5 ", autogenTargetName.c_str());
    }
}